

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void quantize_fp_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined4 local_68;
  int rounding [2];
  
  bVar3 = (byte)iscan;
  iVar1 = (1 << (bVar3 & 0x1f)) >> 1;
  rounding[0] = *zbin_ptr + iVar1 >> (bVar3 & 0x1f);
  rounding[1] = zbin_ptr[1] + iVar1 >> (bVar3 & 0x1f);
  memset(quant_ptr,0 >> (bVar3 & 0x1f),n_coeffs * 4);
  memset(quant_shift_ptr,0,n_coeffs * 4);
  if (eob_ptr == (uint16_t *)0x0 && scan == (int16_t *)0x0) {
    iVar1 = av1_quantize_fp_no_qmatrix
                      (round_ptr,(int16_t *)qcoeff_ptr,zbin_ptr,(int)iscan,dequant_ptr,(int)n_coeffs
                       ,coeff_ptr,(tran_low_t *)quant_ptr,(tran_low_t *)quant_shift_ptr);
    sVar4 = (short)iVar1;
  }
  else {
    lVar9 = 0;
    if (n_coeffs < 1) {
      n_coeffs = lVar9;
    }
    local_68 = 0xffffffff;
    for (; n_coeffs != lVar9; lVar9 = lVar9 + 1) {
      lVar8 = (long)dequant_ptr[lVar9];
      uVar11 = 0x20;
      if (eob_ptr != (uint16_t *)0x0) {
        uVar11 = (ulong)*(byte *)((long)eob_ptr + lVar8);
      }
      uVar12 = 0x20;
      if (scan != (int16_t *)0x0) {
        uVar12 = (uint)*(byte *)((long)scan + lVar8);
      }
      iVar1 = coeff_ptr[lVar8];
      uVar2 = (ulong)(dequant_ptr[lVar9] != 0);
      iVar7 = (int)*(short *)((long)qcoeff_ptr + uVar2 * 2);
      iVar5 = -iVar1;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      if ((long)(iVar7 << (4 - bVar3 & 0x1f)) <= (long)(uVar11 * (long)iVar5)) {
        uVar13 = iVar1 >> 0x1f;
        lVar6 = (long)rounding[uVar2] + (long)iVar5;
        if (0x7ffe < lVar6) {
          lVar6 = 0x7fff;
        }
        if (lVar6 < -0x7fff) {
          lVar6 = -0x8000;
        }
        uVar10 = (uint)((long)(uVar11 * (long)round_ptr[uVar2] * lVar6) >> (0x15 - bVar3 & 0x3f));
        *(uint *)(quant_ptr + lVar8 * 2) = (uVar13 ^ uVar10) - uVar13;
        *(uint *)(quant_shift_ptr + lVar8 * 2) =
             ((int)(((int)(uVar12 * iVar7 + 0x10) >> 5) * uVar10) >> (bVar3 & 0x1f) ^ uVar13) -
             uVar13;
        if (uVar10 != 0) {
          local_68 = (undefined4)lVar9;
        }
      }
    }
    sVar4 = (short)local_68 + 1;
  }
  *(short *)dqcoeff_ptr = sVar4;
  return;
}

Assistant:

static void quantize_fp_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, int log_scale) {
  int i, eob = -1;
  const int rounding[2] = { ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
                            ROUND_POWER_OF_TWO(round_ptr[1], log_scale) };
  // TODO(jingning) Decide the need of these arguments after the
  // quantization process is completed.
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  if (qm_ptr == NULL && iqm_ptr == NULL) {
    *eob_ptr = av1_quantize_fp_no_qmatrix(quant_ptr, dequant_ptr, round_ptr,
                                          log_scale, scan, (int)n_coeffs,
                                          coeff_ptr, qcoeff_ptr, dqcoeff_ptr);
  } else {
    // Quantization pass: All coefficients with index >= zero_flag are
    // skippable. Note: zero_flag can be zero.
    for (i = 0; i < n_coeffs; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const qm_val_t wt = qm_ptr ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const qm_val_t iwt = iqm_ptr ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const int coeff_sign = AOMSIGN(coeff);
      int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      int tmp32 = 0;
      if (abs_coeff * wt >=
          (dequant_ptr[rc != 0] << (AOM_QM_BITS - (1 + log_scale)))) {
        abs_coeff += rounding[rc != 0];
        abs_coeff = clamp64(abs_coeff, INT16_MIN, INT16_MAX);
        tmp32 = (int)((abs_coeff * wt * quant_ptr[rc != 0]) >>
                      (16 - log_scale + AOM_QM_BITS));
        qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
        const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
        dqcoeff_ptr[rc] = (abs_dqcoeff ^ coeff_sign) - coeff_sign;
      }

      if (tmp32) eob = i;
    }
    *eob_ptr = eob + 1;
  }
}